

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O2

long sd_cust(int child,long skip_count)

{
  advanceStream(0x1a,skip_count * 9,0);
  advanceStream(0x1f,skip_count * 2,0);
  advanceStream(0x1b,skip_count,0);
  advanceStream(0x1c,skip_count * 3,0);
  advanceStream(0x1d,skip_count,0);
  advanceStream(0x1e,skip_count,0);
  return 0;
}

Assistant:

long 
sd_cust(int child, DSS_HUGE skip_count)
{
   UNUSED(child);
   
   ADVANCE_STREAM(C_ADDR_SD, skip_count * 9);
   ADVANCE_STREAM(C_CMNT_SD, skip_count * 2);
   ADVANCE_STREAM(C_NTRG_SD, skip_count);
   ADVANCE_STREAM(C_PHNE_SD, 3L * skip_count);
   ADVANCE_STREAM(C_ABAL_SD, skip_count);
   ADVANCE_STREAM(C_MSEG_SD, skip_count);
   return(0L);
}